

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::on_12_hour(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
             *this,numeric_system ns)

{
  long lVar1;
  long lVar2;
  tm time;
  
  if (ns != standard) {
    time.tm_isdst = 0;
    time._36_4_ = 0;
    time.tm_gmtoff = 0;
    time.tm_mon = 0;
    time.tm_year = 0;
    time.tm_wday = 0;
    time.tm_yday = 0;
    time.tm_sec = 0;
    time.tm_min = 0;
    time.tm_zone = (char *)0x0;
    time._8_8_ = ((this->s).__r / 0xe10) % 0x18 & 0xffffffff;
    format_localized(this,&time,"%OI");
    return;
  }
  lVar2 = ((this->s).__r / 0xe10) % 0xc;
  lVar1 = 0xc;
  if (0 < lVar2) {
    lVar1 = lVar2;
  }
  time.tm_zone = (char *)0x2;
  write(this,(int)lVar1,(void *)0x2,0xc);
  return;
}

Assistant:

void on_12_hour(numeric_system ns) {
    if (ns == numeric_system::standard)
      return write(hour12(), 2);
    auto time = tm();
    time.tm_hour = hour();
    format_localized(time, "%OI");
  }